

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jactions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jobservations)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong __n;
  Index IVar4;
  size_t nrO;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAO_Is;
  allocator_type local_61;
  double local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  unsigned_long_long local_40;
  value_type_conflict1 local_34;
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  
  __n = (ulong)t;
  puVar1 = (this->_m_firstJAOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_m_firstJAOHIforT).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= __n) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__n);
  }
  local_40 = puVar1[__n];
  local_60 = (double)(**(code **)((long)*this->_m_madp + 0x68))();
  nrO = (**(code **)((long)*this->_m_madp + 200))();
  auVar10._8_56_ = extraout_var;
  auVar10._0_8_ = extraout_XMM0_Qa;
  local_34 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_58,__n,&local_34,&local_61);
  auVar9 = auVar10._0_16_;
  if (t != 0) {
    uVar7 = 0;
    do {
      puVar2 = (Jactions->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(Jactions->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar7) {
LAB_004073b4:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      puVar3 = (Jobservations->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(Jobservations->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar7)
      goto LAB_004073b4;
      IVar4 = IndexTools::ActionAndObservation_to_ActionObservationIndex
                        (puVar2[uVar7],puVar3[uVar7],(size_t)local_60,nrO);
      auVar9 = auVar10._0_16_;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = IVar4;
      uVar7 = uVar7 + 1;
    } while (t != (Index)uVar7);
  }
  IVar4 = Globals::CastLIndexToIndex(local_40);
  puVar2 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (t != 0) {
    uVar7 = (ulong)IVar4;
    auVar9 = vcvtusi2sd_avx512f(auVar9,nrO * (long)local_60);
    local_60 = auVar9._0_8_;
    iVar6 = t - 1;
    lVar8 = 0;
    do {
      auVar11._0_8_ = pow(local_60,(double)iVar6);
      auVar11._8_56_ = extraout_var_00;
      lVar5 = vcvttsd2usi_avx512f(auVar11._0_16_);
      uVar7 = uVar7 + (ulong)*(uint *)((long)puVar2 + lVar8) * lVar5;
      IVar4 = (Index)uVar7;
      lVar8 = lVar8 + 4;
      iVar6 = iVar6 + -1;
    } while (__n << 2 != lVar8);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex(
        Index t, 
        const vector<Index>& Jactions,
        const vector<Index>& Jobservations
        ) const
{
    //functioning is the same as for observation histories:
    //(only now the base is the nr AO)

    LIndex first_JAOHI=_m_firstJAOHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    size_t nrJO = GetNrJointObservations();
    size_t nrJAO = nrJA * nrJO;
 
    vector<Index> JAO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        JAO_Is[ts] = IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    Jactions.at(ts), Jobservations.at(ts), nrJA, nrJO);
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(first_JAOHI),
                &JAO_Is[0],
                nrJAO
                )
          );    
}